

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiz-spoil.c
# Opt level: O2

void spoil_mon_desc(char *fname)

{
  ushort uVar1;
  wchar_t wVar2;
  monster_race *pmVar3;
  angband_constants *paVar4;
  monster_race *pmVar5;
  _Bool _Var6;
  void *base;
  uint uVar7;
  char **ppcVar8;
  ulong uVar9;
  long lVar10;
  char *fmt;
  char *pcVar11;
  size_t sVar12;
  uint uVar13;
  char spd [80];
  char hp [80];
  char ac [80];
  char rar [80];
  char exp [80];
  char lev [80];
  char nam [80];
  char buf [1024];
  
  path_build(buf,0x400,ANGBAND_DIR_USER,fname);
  uVar13 = 0;
  fh = file_open(buf,MODE_WRITE,FTYPE_TEXT);
  if (fh == (ang_file *)0x0) {
    pcVar11 = "Cannot create spoiler file.";
  }
  else {
    file_putf(fh,"Monster Spoilers for %s\n",buildid);
    file_putf(fh,"------------------------------------------\n\n");
    file_putf(fh,"%-40.40s%4s%4s%6s%8s%4s  %11.11s\n","Name","Lev","Rar","Spd","Hp","Ac",
              "Visual Info");
    file_putf(fh,"%-40.40s%4s%4s%6s%8s%4s  %11.11s\n","----","---","---","---","--","--",
              "-----------");
    base = mem_zalloc((ulong)((uint)z_info->r_max * 2));
    paVar4 = z_info;
    ppcVar8 = &r_info[1].name;
    for (lVar10 = 1; sVar12 = (size_t)(int)uVar13, lVar10 < (long)((ulong)paVar4->r_max - 1);
        lVar10 = lVar10 + 1) {
      if (*ppcVar8 != (char *)0x0) {
        uVar13 = uVar13 + 1;
        *(short *)((long)base + sVar12 * 2) = (short)lVar10;
      }
      ppcVar8 = ppcVar8 + 0x1a;
    }
    sort(base,sVar12,2,cmp_monsters);
    if ((int)uVar13 < 1) {
      uVar13 = 0;
    }
    for (uVar9 = 0; pmVar5 = r_info, uVar13 != uVar9; uVar9 = uVar9 + 1) {
      uVar1 = *(ushort *)((long)base + uVar9 * 2);
      pmVar3 = r_info + uVar1;
      pcVar11 = r_info[uVar1].name;
      _Var6 = flag_has_dbg(pmVar3->flags,0xb,2,"race->flags","RF_QUESTOR");
      fmt = "[Q] %s";
      if (!_Var6) {
        _Var6 = flag_has_dbg(pmVar3->flags,0xb,1,"race->flags","RF_UNIQUE");
        fmt = "The %s";
        if (_Var6) {
          fmt = "[U] %s";
        }
      }
      strnfmt(nam,0x50,fmt,pcVar11);
      strnfmt(lev,0x50,"%d",(ulong)(uint)pmVar5[uVar1].level);
      strnfmt(rar,0x50,"%d",(ulong)(uint)pmVar5[uVar1].rarity);
      wVar2 = pmVar5[uVar1].speed;
      if (wVar2 < L'n') {
        uVar7 = 0x6e - wVar2;
        pcVar11 = "-%d";
      }
      else {
        uVar7 = wVar2 + L'\xffffff92';
        pcVar11 = "+%d";
      }
      strnfmt(spd,0x50,pcVar11,(ulong)uVar7);
      strnfmt(ac,0x50,"%d",(ulong)(uint)pmVar5[uVar1].ac);
      strnfmt(hp,0x50,"%d",(ulong)(uint)pmVar5[uVar1].avg_hp);
      strnfmt(exp,0x50,"%ld",(long)pmVar5[uVar1].mexp);
      pcVar11 = attr_to_text(pmVar5[uVar1].d_attr);
      strnfmt(exp,0x50,"%s \'%c\'",pcVar11,(ulong)(uint)pmVar5[uVar1].d_char);
      sVar12 = utf8_strlen(nam);
      if (sVar12 < 0x28) {
        file_putf(fh,"%s%*s",nam,(ulong)(0x28 - (int)sVar12)," ");
      }
      else {
        if (sVar12 != 0x28) {
          utf8_clipto(nam,0x28);
        }
        file_putf(fh,"%s",nam);
      }
      file_putf(fh,"%4s%4s%6s%8s%4s  %11.11s\n",lev,rar,spd,hp,ac,exp);
    }
    file_putf(fh,"\n");
    mem_free(base);
    _Var6 = file_close(fh);
    pcVar11 = "Cannot close spoiler file.";
    if (_Var6) {
      pcVar11 = "Successfully created a spoiler file.";
    }
  }
  msg(pcVar11);
  return;
}

Assistant:

void spoil_mon_desc(const char *fname)
{
	int i, n = 0;

	char buf[1024];

	char nam[80];
	char lev[80];
	char rar[80];
	char spd[80];
	char ac[80];
	char hp[80];
	char exp[80];

	uint16_t *who;

	/* Build the filename */
	path_build(buf, sizeof(buf), ANGBAND_DIR_USER, fname);
	fh = file_open(buf, MODE_WRITE, FTYPE_TEXT);

	/* Oops */
	if (!fh) {
		msg("Cannot create spoiler file.");
		return;
	}

	/* Dump the header */
	file_putf(fh, "Monster Spoilers for %s\n", buildid);
	file_putf(fh, "------------------------------------------\n\n");

	/* Dump the header */
	file_putf(fh, "%-40.40s%4s%4s%6s%8s%4s  %11.11s\n",
	        "Name", "Lev", "Rar", "Spd", "Hp", "Ac", "Visual Info");
	file_putf(fh, "%-40.40s%4s%4s%6s%8s%4s  %11.11s\n",
	        "----", "---", "---", "---", "--", "--", "-----------");

	/* Allocate the "who" array */
	who = mem_zalloc(z_info->r_max * sizeof(uint16_t));

	/* Scan the monsters (except the ghost) */
	for (i = 1; i < z_info->r_max - 1; i++) {
		struct monster_race *race = &r_info[i];

		/* Use that monster */
		if (race->name) who[n++] = (uint16_t)i;
	}

	/* Sort the array by dungeon depth of monsters */
	sort(who, n, sizeof(*who), cmp_monsters);

	/* Scan again */
	for (i = 0; i < n; i++) {
		struct monster_race *race = &r_info[who[i]];
		const char *name = race->name;
		size_t u8len;

		/* Get the "name" */
		if (rf_has(race->flags, RF_QUESTOR))
			strnfmt(nam, sizeof(nam), "[Q] %s", name);
		else if (rf_has(race->flags, RF_UNIQUE))
			strnfmt(nam, sizeof(nam), "[U] %s", name);
		else
			strnfmt(nam, sizeof(nam), "The %s", name);

		/* Level */
		strnfmt(lev, sizeof(lev), "%d", race->level);

		/* Rarity */
		strnfmt(rar, sizeof(rar), "%d", race->rarity);

		/* Speed */
		if (race->speed >= 110)
			strnfmt(spd, sizeof(spd), "+%d", (race->speed - 110));
		else
			strnfmt(spd, sizeof(spd), "-%d", (110 - race->speed));

		/* Armor Class */
		strnfmt(ac, sizeof(ac), "%d", race->ac);

		/* Hitpoints */
		strnfmt(hp, sizeof(hp), "%d", race->avg_hp);

		/* Experience */
		strnfmt(exp, sizeof(exp), "%ld", (long)(race->mexp));

		/* Hack -- use visual instead */
		strnfmt(exp, sizeof(exp), "%s '%c'", attr_to_text(race->d_attr),
				race->d_char);

		/*
		 * Dump the info.  The rationale for handling the first column
		 * separately is the same as in spoil_obj_desc():  better
		 * alignment if there are multibyte characters in the name.
		 */
		u8len = utf8_strlen(nam);
		if (u8len < 40) {
			file_putf(fh, "%s%*s", nam, (int) (40 - u8len), " ");
		} else {
			if (u8len > 40) {
				utf8_clipto(nam, 40);
			}
			file_putf(fh, "%s", nam);
		}
		file_putf(fh, "%4s%4s%6s%8s%4s  %11.11s\n",
		        lev, rar, spd, hp, ac, exp);
	}

	/* End it */
	file_putf(fh, "\n");

	/* Free the "who" array */
	mem_free(who);

	/* Check for errors */
	if (!file_close(fh)) {
		msg("Cannot close spoiler file.");
		return;
	}

	/* Worked */
	msg("Successfully created a spoiler file.");
}